

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O1

string * __thiscall
iDynTree::MatrixFixSize<4u,4u>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  size_t col;
  long lVar2;
  size_t row;
  long lVar3;
  stringstream ss;
  stringstream asStack_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(*(double *)((long)this + lVar2 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
    this = (void *)((long)this + 0x20);
  } while (lVar3 != 4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string MatrixFixSize<nRows,nCols>::toString() const
    {
        std::stringstream ss;

        for(std::size_t row=0; row < this->rows(); row++ )
        {
            for(std::size_t col=0; col < this->cols(); col++ )
            {
                ss << this->m_data[this->rawIndexRowMajor(row,col)] << " ";
            }
            ss << std::endl;
        }

        return ss.str();
    }